

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

string * __thiscall
bsim::quad_value_bit_vector::binary_string_abi_cxx11_(quad_value_bit_vector *this)

{
  quad_value_bit_vector *in_RSI;
  string *in_RDI;
  int i;
  int N;
  string *str;
  quad_value_bit_vector *in_stack_ffffffffffffff78;
  string local_50 [24];
  quad_value *in_stack_ffffffffffffffc8;
  int local_2c;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  local_2c = bitLength(in_RSI);
  while (local_2c = local_2c + -1, -1 < local_2c) {
    get(in_stack_ffffffffffffff78,0);
    quad_value::binary_string_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::__cxx11::string::operator+=(in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return in_RDI;
}

Assistant:

std::string binary_string() const {
      std::string str = "";
      const int N = bitLength();
      for (int i = N - 1; i >= 0; i--) {
        str += get(i).binary_string();
      }

      return str;
    }